

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

int try_disarm(trap *ttmp,boolean force_failure,schar dx,schar dy)

{
  int *piVar1;
  xchar x;
  xchar y;
  monst *pmVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  obj *poVar6;
  char *pcVar7;
  trap *trap;
  monst *mtmp;
  undefined7 in_register_00000031;
  char *pcVar8;
  char cVar9;
  uint uVar10;
  xchar cy;
  xchar cx;
  xchar by;
  xchar bx;
  boolean local_39;
  undefined4 local_38;
  int bc;
  
  pmVar2 = level->monsters[ttmp->tx][ttmp->ty];
  mtmp = (monst *)0x0;
  if ((pmVar2 != (monst *)0x0) && ((pmVar2->field_0x61 & 2) == 0)) {
    mtmp = pmVar2;
  }
  uVar10 = (byte)ttmp->field_0x8 & 0x1f;
  cVar9 = (char)uVar10;
  if (mtmp == (monst *)0x0) {
LAB_0025ab2d:
    local_38 = (undefined4)CONCAT71(in_register_00000031,force_failure);
    poVar6 = sobj_at(0x214,level,(int)ttmp->tx,(int)ttmp->ty);
    if ((poVar6 != (obj *)0x0) &&
       ((((u.uprops[0x3e].intrinsic == 0 && (u.uprops[0x3e].extrinsic == 0)) &&
         (dy != '\0' || dx != '\0')) && (((youmonst.data)->mflags1 & 8) == 0)))) {
      pline("There is a boulder in your way.");
      return 0;
    }
    if (((dy == '\0' || dx == '\0') ||
        (bVar3 = bad_rock(youmonst.data,'\x01',u.ux,ttmp->ty), bVar3 == '\0')) ||
       (bVar3 = bad_rock(youmonst.data,'\x01',ttmp->tx,u.uy), bVar3 == '\0')) {
LAB_0025ac29:
      bVar3 = can_reach_floor();
      if (bVar3 != '\0') {
        if (((char)local_38 == '\0') && (iVar4 = untrap_prob(ttmp), iVar4 == 0)) {
          return 2;
        }
        iVar4 = rnl(5);
        if (iVar4 == 0) {
          pcVar7 = "That";
          if (dy == '\0' && dx == '\0') {
            pcVar7 = "This";
          }
          pcVar8 = "Your";
          if (-1 < (char)ttmp->field_0x8) {
            pcVar8 = pcVar7;
          }
          pcVar7 = "disarm";
          if (cVar9 == '\x13') {
            pcVar7 = "remove";
          }
          pline("%s %s is difficult to %s.",pcVar8,defexplain[(ulong)uVar10 + 0x2f],pcVar7);
          return 1;
        }
        pline("Whoops...");
        if (mtmp == (monst *)0x0) {
          if (dy == '\0' && dx == '\0') {
            dotrap(ttmp,0);
            return 1;
          }
          x = ttmp->tx;
          y = ttmp->ty;
          if ((uball != (obj *)0x0) &&
             (bVar3 = drag_ball(x,y,&bc,&bx,&by,&cx,&cy,&local_39,'\x01'), bVar3 == '\0')) {
            return 1;
          }
          iVar5 = (int)u.ux;
          u.ux0 = u.ux;
          iVar4 = (int)u.uy;
          u.uy0 = u.uy;
          u.umoved = '\x01';
          u.ux = x;
          u.uy = y;
          newsym(iVar5,iVar4);
          vision_recalc(1);
          check_leash(u.ux0,u.uy0);
          if (uball != (obj *)0x0) {
            move_bc(0,bc,bx,by,cx,cy);
          }
          spoteffects('\0');
          exercise(2,'\0');
          return 1;
        }
        if (cVar9 == '\x05') {
          if (mtmp->mtame != '\0') {
            abuse_dog(mtmp);
          }
          iVar5 = rnd(4);
          piVar1 = &mtmp->mhp;
          iVar4 = *piVar1;
          *piVar1 = *piVar1 - iVar5;
          if (*piVar1 == 0 || SBORROW4(iVar4,iVar5) != *piVar1 < 0) {
            killed(mtmp);
            return 1;
          }
          return 1;
        }
        iVar4 = 1;
        if (cVar9 != '\x13') {
          return 1;
        }
        if (youmonst.data != mons + 100 && youmonst.data != mons + 0x62) {
          trap = maketrap(level,(int)u.ux,(int)u.uy,0x13);
          if (trap == (trap *)0x0) {
            return 1;
          }
          pline("The webbing sticks to you. You\'re caught too!");
          dotrap(trap,1);
          if (u.usteed != (monst *)0x0) {
            if (u.utrap != 0) {
              dismount_steed(1);
              return 1;
            }
            return 1;
          }
          return 1;
        }
        pcVar7 = Monnam(mtmp);
        pcVar8 = "%s remains entangled.";
        goto LAB_0025ad62;
      }
      if ((u.usteed != (monst *)0x0) && (u.weapon_skills[0x27].skill < '\x02')) {
        pcVar7 = mon_nam(u.usteed);
        pcVar8 = "You aren\'t skilled enough to reach from %s.";
        goto LAB_0025ace6;
      }
      pcVar7 = defexplain[(ulong)uVar10 + 0x2f];
    }
    else {
      if (invent == (obj *)0x0) {
LAB_0025ac0d:
        if ((youmonst.data)->msize < 3) goto LAB_0025ac29;
      }
      else {
        iVar4 = inv_weight();
        iVar5 = weight_cap();
        if (iVar5 + iVar4 < 0x259) goto LAB_0025ac0d;
      }
      pcVar7 = defexplain[(ulong)uVar10 + 0x2f];
    }
    pcVar8 = "You are unable to reach the %s!";
    iVar4 = 0;
  }
  else {
    if (((mtmp->field_0x62 & 0x80) != 0) && (cVar9 == '\x05' || cVar9 == '\x13')) goto LAB_0025ab2d;
    pcVar7 = Monnam(mtmp);
    pcVar8 = "%s is in the way.";
LAB_0025ace6:
    iVar4 = 0;
  }
LAB_0025ad62:
  pline(pcVar8,pcVar7);
  return iVar4;
}

Assistant:

static int try_disarm(struct trap *ttmp, boolean force_failure, schar dx, schar dy)
{
	struct monst *mtmp = m_at(level, ttmp->tx,ttmp->ty);
	int ttype = ttmp->ttyp;
	boolean under_u = (!dx && !dy);
	boolean holdingtrap = (ttype == BEAR_TRAP || ttype == WEB);
	
	/* Test for monster first, monsters are displayed instead of trap. */
	if (mtmp && (!mtmp->mtrapped || !holdingtrap)) {
		pline("%s is in the way.", Monnam(mtmp));
		return 0;
	}
	/* We might be forced to move onto the trap's location. */
	if (sobj_at(BOULDER, level, ttmp->tx, ttmp->ty)
				&& !Passes_walls && !under_u) {
		pline("There is a boulder in your way.");
		return 0;
	}
	/* duplicate tight-space checks from test_move */
	if (dx && dy &&
	    bad_rock(youmonst.data, TRUE, u.ux, ttmp->ty) &&
	    bad_rock(youmonst.data, TRUE, ttmp->tx, u.uy)) {
	    if ((invent && (inv_weight() + weight_cap() > 600)) ||
		bigmonst(youmonst.data)) {
		/* don't allow untrap if they can't get thru to it */
		pline("You are unable to reach the %s!",
		    trapexplain[ttype-1]);
		return 0;
	    }
	}
	/* untrappable traps are located on the ground. */
	if (!can_reach_floor()) {
		if (u.usteed && P_SKILL(P_RIDING) < P_BASIC)
			pline("You aren't skilled enough to reach from %s.",
				mon_nam(u.usteed));
		else
			pline("You are unable to reach the %s!",
			trapexplain[ttype-1]);
		return 0;
	}

	/* Will our hero succeed? */
	if (force_failure || untrap_prob(ttmp)) {
		if (rnl(5)) {
		    pline("Whoops...");
		    if (mtmp) {		/* must be a trap that holds monsters */
			if (ttype == BEAR_TRAP) {
			    if (mtmp->mtame) abuse_dog(mtmp);
			    if ((mtmp->mhp -= rnd(4)) <= 0) killed(mtmp);
			} else if (ttype == WEB) {
			    if (!webmaker(youmonst.data)) {
				struct trap *ttmp2 = maketrap(level, u.ux, u.uy, WEB);
				if (ttmp2) {
				    pline("The webbing sticks to you. You're caught too!");
				    dotrap(ttmp2, NOWEBMSG);
				    if (u.usteed && u.utrap) {
					/* you, not steed, are trapped */
					dismount_steed(DISMOUNT_FELL);
				    }
				}
			    } else
				pline("%s remains entangled.", Monnam(mtmp));
			}
		    } else if (under_u) {
			dotrap(ttmp, 0);
		    } else {
			move_into_trap(ttmp);
		    }
		} else {
		    pline("%s %s is difficult to %s.",
			  ttmp->madeby_u ? "Your" : under_u ? "This" : "That",
			  trapexplain[ttype-1],
			  (ttype == WEB) ? "remove" : "disarm");
		}
		return 1;
	}
	return 2;
}